

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseUsingDeclaration(StructuralParser *this)

{
  ModuleBase *pMVar1;
  UsingDeclaration *o;
  pool_ref<soul::AST::UsingDeclaration> local_58;
  Expression *local_50;
  Expression *type;
  Identifier local_30;
  Identifier name;
  Context context;
  StructuralParser *this_local;
  
  getContext((Context *)&name,this);
  local_30 = parseIdentifier(this);
  type = (Expression *)0x54e52c;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54e52c);
  local_50 = parseType(this,usingDeclTarget);
  pMVar1 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  o = allocate<soul::AST::UsingDeclaration,soul::AST::Context&,soul::Identifier&,soul::AST::Expression&>
                (this,(Context *)&name,&local_30,local_50);
  pool_ref<soul::AST::UsingDeclaration>::pool_ref<soul::AST::UsingDeclaration,void>(&local_58,o);
  std::
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  ::push_back(&pMVar1->usings,&local_58);
  pool_ref<soul::AST::UsingDeclaration>::~pool_ref(&local_58);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54c9e0);
  AST::Context::~Context((Context *)&name);
  return;
}

Assistant:

void parseUsingDeclaration()
    {
        auto context = getContext();
        auto name = parseIdentifier();

        expect (Operator::assign);

        auto& type = parseType (ParseTypeContext::usingDeclTarget);
        module->usings.push_back (allocate<AST::UsingDeclaration> (context, name, type));

        expect (Operator::semicolon);
    }